

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O3

void __thiscall wasm::OptimizeAddedConstants::findPropagatable(OptimizeAddedConstants *this)

{
  Expression *pEVar1;
  long *plVar2;
  _Hash_node_base *p_Var3;
  Locations *pLVar4;
  _Base_ptr p_Var5;
  SetInfluences *pSVar6;
  __node_base *p_Var7;
  TaskFunc p_Var8;
  ulong uVar9;
  __hash_code __code;
  _Rb_tree_header *p_Var10;
  undefined1 auStack_1b8 [8];
  GetParents parents;
  LocalSet *set;
  
  parents.inner.parentMap._M_h._M_single_bucket =
       (__node_base_ptr)
       ((this->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
        ).
        super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
        .
        super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
       .currFunction)->body;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .expressionStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)&parents.inner.parentMap._M_h._M_rehash_policy._M_next_resize;
  auStack_1b8 = (undefined1  [8])0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .replacep = (Expression **)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .expressionStack.fixed._M_elems[9] = (Expression *)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .expressionStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .expressionStack.flexible.
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .currFunction = (Function *)0x0;
  parents.inner.
  super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  .currModule = (Module *)0x0;
  parents.inner.parentMap._M_h._M_buckets = (__buckets_ptr)0x1;
  parents.inner.parentMap._M_h._M_bucket_count = 0;
  parents.inner.parentMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  parents.inner.parentMap._M_h._M_element_count._0_4_ = 0x3f800000;
  parents.inner.parentMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  parents.inner.parentMap._M_h._M_rehash_policy._4_4_ = 0;
  parents.inner.parentMap._M_h._M_rehash_policy._M_next_resize = 0;
  Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
              *)auStack_1b8,
             ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             ::scan,(Expression **)&parents.inner.parentMap._M_h._M_single_bucket);
  if (((long)parents.inner.
             super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)parents.inner.
             super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .stack.fixed._M_elems[9].currp >> 4) +
      (long)parents.inner.
            super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .replacep != 0) {
    do {
      if ((pointer)parents.inner.
                   super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          parents.inner.
          super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
          .
          super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
          .stack.flexible.
          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (parents.inner.
            super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .
            super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
            .replacep == (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::GetParents::Inner, wasm::Visitor<wasm::(anonymous namespace)::GetParents::Inner>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::GetParents::Inner, wasm::Visitor<wasm::(anonymous namespace)::GetParents::Inner>>::Task, N = 10]"
                       );
        }
        p_Var8 = *(TaskFunc *)
                  ((long)(&parents.inner.
                           super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                           .
                           super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                         + -1) + 0xd0 +
                  (long)parents.inner.
                        super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                        .
                        super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                        .replacep * 0x10);
        auStack_1b8 = (undefined1  [8])
                      parents.inner.
                      super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                      .stack.fixed._M_elems
                      [(long)parents.inner.
                             super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                             .
                             super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                             .replacep + -1].func;
        parents.inner.
        super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
        .replacep = (Expression **)
                    ((long)parents.inner.
                           super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                           .
                           super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                           .replacep + -1);
      }
      else {
        p_Var8 = parents.inner.
                 super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                 .
                 super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                 .
                 super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                 .stack.flexible.
                 super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].func;
        auStack_1b8 = (undefined1  [8])
                      parents.inner.
                      super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                      .
                      super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                      .
                      super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                      .stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].currp;
        parents.inner.
        super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
        .
        super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
        .
        super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             parents.inner.
             super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .
             super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      if (*(Expression **)auStack_1b8 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<wasm::(anonymous namespace)::GetParents::Inner, wasm::Visitor<wasm::(anonymous namespace)::GetParents::Inner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::GetParents::Inner, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::GetParents::Inner>]"
                     );
      }
      (*p_Var8)((Inner *)auStack_1b8,(Expression **)auStack_1b8);
    } while (((long)parents.inner.
                    super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)parents.inner.
                    super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .stack.fixed._M_elems[9].currp >> 4) +
             (long)parents.inner.
                   super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .
                   super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                   .replacep != 0);
  }
  pLVar4 = LazyLocalGraph::getLocations
                     ((this->localGraph)._M_t.
                      super___uniq_ptr_impl<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::LazyLocalGraph_*,_std::default_delete<wasm::LazyLocalGraph>_>
                      .super__Head_base<0UL,_wasm::LazyLocalGraph_*,_false>._M_head_impl);
  p_Var5 = (pLVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(pLVar4->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var10) {
    do {
      parents.inner.parentMap._M_h._M_single_bucket = (__node_base_ptr)*(LocalSet **)(p_Var5 + 1);
      if (((*(LocalSet **)(p_Var5 + 1))->super_SpecificExpression<(wasm::Expression::Id)9>).
          super_Expression._id != LocalSetId) {
        parents.inner.parentMap._M_h._M_single_bucket = (__node_base_ptr)(LocalSet *)0x0;
      }
      if (((((LocalSet *)parents.inner.parentMap._M_h._M_single_bucket != (LocalSet *)0x0) &&
           (pEVar1 = ((LocalSet *)parents.inner.parentMap._M_h._M_single_bucket)->value,
           pEVar1->_id == BinaryId)) && (*(int *)(pEVar1 + 1) == 0)) &&
         ((*(char *)pEVar1[1].type.id == '\x0e' || (**(char **)(pEVar1 + 2) == '\x0e')))) {
        pSVar6 = LazyLocalGraph::getSetInfluences
                           ((this->localGraph)._M_t.
                            super___uniq_ptr_impl<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::LazyLocalGraph_*,_std::default_delete<wasm::LazyLocalGraph>_>
                            .super__Head_base<0UL,_wasm::LazyLocalGraph_*,_false>._M_head_impl,
                            (LocalSet *)parents.inner.parentMap._M_h._M_single_bucket);
        p_Var7 = &(pSVar6->_M_h)._M_before_begin;
        do {
          p_Var7 = p_Var7->_M_nxt;
          if (p_Var7 == (__node_base *)0x0) {
            std::
            _Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
            ::_M_insert_unique<wasm::LocalSet*const&>
                      ((_Rb_tree<wasm::LocalSet*,wasm::LocalSet*,std::_Identity<wasm::LocalSet*>,std::less<wasm::LocalSet*>,std::allocator<wasm::LocalSet*>>
                        *)&this->propagatable,
                       (LocalSet **)&parents.inner.parentMap._M_h._M_single_bucket);
            break;
          }
          uVar9 = (ulong)p_Var7[1]._M_nxt % (ulong)parents.inner.parentMap._M_h._M_buckets;
          if (parents.inner.
              super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
              .expressionStack.flexible.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[uVar9] == (Expression *)0x0) {
LAB_009aab18:
            __assert_fail("iter != inner.parentMap.end()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeAddedConstants.cpp"
                          ,0x32,
                          "Expression *wasm::(anonymous namespace)::GetParents::getParent(LocalGet *) const"
                         );
          }
          plVar2 = *(long **)parents.inner.
                             super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                             .expressionStack.flexible.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage[uVar9];
          p_Var3 = (_Hash_node_base *)plVar2[1];
          while (p_Var7[1]._M_nxt != p_Var3) {
            plVar2 = (long *)*plVar2;
            if ((plVar2 == (long *)0x0) ||
               (p_Var3 = (_Hash_node_base *)plVar2[1],
               (ulong)p_Var3 % (ulong)parents.inner.parentMap._M_h._M_buckets != uVar9))
            goto LAB_009aab18;
          }
          if ((byte *)plVar2[2] == (byte *)0x0) {
            __assert_fail("parent",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeAddedConstants.cpp"
                          ,0x187,"void wasm::OptimizeAddedConstants::findPropagatable()");
          }
        } while ((*(byte *)plVar2[2] & 0xfe) == 0xc);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var10);
  }
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&parents.inner.
                    super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .expressionStack.flexible.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (parents.inner.
      super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
      .expressionStack.fixed._M_elems[9] != (Expression *)0x0) {
    operator_delete(parents.inner.
                    super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .expressionStack.fixed._M_elems[9],
                    (long)parents.inner.
                          super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .expressionStack.flexible.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)parents.inner.
                          super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .expressionStack.fixed._M_elems[9]);
  }
  if (parents.inner.
      super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
      .
      super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
      .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
    operator_delete(parents.inner.
                    super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .
                    super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)parents.inner.
                          super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)parents.inner.
                          super_ExpressionStackWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .
                          super_PostWalker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::GetParents::Inner,_wasm::Visitor<wasm::(anonymous_namespace)::GetParents::Inner,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  return;
}

Assistant:

void findPropagatable() {
    // Conservatively, only propagate if all uses can be removed of the
    // original. That is,
    //  x = a + 10
    //  f(x)
    //  g(x)
    // should be optimized to
    //  f(a, offset=10)
    //  g(a, offset=10)
    // but if x has other uses, then avoid doing so - we'll be doing that add
    // anyhow, so the load/store offset trick won't actually help.
    GetParents parents(getFunction()->body);
    for (auto& [location, _] : localGraph->getLocations()) {
      if (auto* set = location->dynCast<LocalSet>()) {
        if (auto* add = set->value->dynCast<Binary>()) {
          if (add->op == AddInt32) {
            if (add->left->is<Const>() || add->right->is<Const>()) {
              // Looks like this might be relevant, check all uses.
              bool canPropagate = true;
              for (auto* get : localGraph->getSetInfluences(set)) {
                auto* parent = parents.getParent(get);
                // if this is at the top level, it's the whole body - no set can
                // exist!
                assert(parent);
                if (!(parent->is<Load>() || parent->is<Store>())) {
                  canPropagate = false;
                  break;
                }
              }
              if (canPropagate) {
                propagatable.insert(set);
              }
            }
          }
        }
      }
    }
  }